

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O1

void __thiscall btDbvtNodeEnumerator::Process(btDbvtNodeEnumerator *this,btDbvtNode *n)

{
  int iVar1;
  int iVar2;
  btDbvtNode **ptr;
  btDbvtNode **ppbVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  iVar1 = (this->nodes).m_size;
  iVar2 = (this->nodes).m_capacity;
  if (iVar1 == iVar2) {
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    if (iVar2 < iVar6) {
      if (iVar6 == 0) {
        ppbVar3 = (btDbvtNode **)0x0;
      }
      else {
        ppbVar3 = (btDbvtNode **)btAlignedAllocInternal((long)iVar6 << 3,0x10);
      }
      lVar4 = (long)(this->nodes).m_size;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          ppbVar3[lVar5] = (this->nodes).m_data[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      ptr = (this->nodes).m_data;
      if (ptr != (btDbvtNode **)0x0) {
        if ((this->nodes).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->nodes).m_data = (btDbvtNode **)0x0;
      }
      (this->nodes).m_ownsMemory = true;
      (this->nodes).m_data = ppbVar3;
      (this->nodes).m_capacity = iVar6;
    }
  }
  iVar1 = (this->nodes).m_size;
  (this->nodes).m_data[iVar1] = n;
  (this->nodes).m_size = iVar1 + 1;
  return;
}

Assistant:

void Process(const btDbvtNode* n) { nodes.push_back(n); }